

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_incremental_refresh_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
::operator()(MessageVisitor<should_visit_incremental_refresh_frame::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
             *this)

{
  _Base_bitset<1UL> _Var1;
  StreamCursor *this_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  char *errFmt;
  ParsingContext *this_01;
  Type type;
  undefined1 local_470 [8];
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  header;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  message;
  FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  messageVisitor_1;
  FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  messageVisitor;
  int local_38;
  uint local_34;
  int checksum;
  int tag;
  
  _Var1._M_w = (long)&header.
                      super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                      .
                      super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                      .unparsed.
                      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
                      .
                      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
                      .
                      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_void>
               + 0x10;
  memset(local_470,0,400);
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (void *)((long)(header.
                       super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                       .
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                       .unparsed.Storage.InlineElts + 8) + 0x10);
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .allBits.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)
       ((long)&message.
               super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
               .
               super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
               .unparsed.
               super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
               .
               super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
               .
               super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
       + 0x10);
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_false>
  .value.m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .requiredBits.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_false>.
  value.m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_false>
  .value.m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_false>.value.
  m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_false>.
  value.m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<281U,_Fixpp::Type::Char>_>,_false>
  .value.m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_false>.value.
  m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_false>.value.
  m_view.second = 0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<281U,_Fixpp::Type::Char>_>,_false>
  .value.m_view.first = (char *)0x0;
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x10] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x11] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x12] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x13] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x14] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x15] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x16] = '\0';
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer[0x17] = '\0';
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .values.base.
  super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_false>.value.
  m_view.first = (char *)0x0;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX =
       (void *)((long)(message.
                       super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                       .
                       super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                       .unparsed.Storage.InlineElts + 8) + 0x10);
  local_38 = 0;
  this_00 = (StreamCursor *)**(undefined8 **)this;
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .allBits.super__Base_bitset<1UL>._M_w = _Var1;
  header.
  super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed,_void>
  .super_SmallVectorBase.BeginX = (void *)_Var1;
  message.
  super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .
  super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  .unparsed.
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
  .
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_void>
  .super_SmallVectorBase.BeginX =
       (void *)message.
               super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
               .
               super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
               .allBits.super__Base_bitset<1UL>._M_w;
  bVar2 = false;
LAB_00a848db:
  do {
    bVar4 = bVar2;
    bVar2 = StreamCursor::eof(this_00);
    if ((bVar2) || (*(char *)(*(long *)this + 0x38) != '\x01')) {
LAB_00a84a8f:
      if (*(char *)(*(long *)this + 0x38) == '\x01') {
        callVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)89>,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::TagT<281u,Fixpp::Type::Char>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>
                  (this,local_470,
                   (long)(header.
                          super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                          .
                          super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                          .unparsed.Storage.InlineElts + 8) + 0x10);
      }
      goto LAB_00a84adc;
    }
    bVar2 = match_int_fast((int *)&local_34,this_00);
    if (!bVar2) {
      this_01 = *(ParsingContext **)this;
      bVar2 = StreamCursor::eof(this_00);
      cVar5 = '?';
      if (!bVar2) {
        cVar5 = StreamCursor::current(this_00);
      }
      errFmt = "Encountered invalid tag, expected int, got \'%c\'";
LAB_00a84a5f:
      local_34 = (uint)cVar5;
      type = ParsingError;
LAB_00a84a73:
      ParsingContext::setError(this_01,type,errFmt,(ulong)local_34);
      goto LAB_00a84adc;
    }
    bVar2 = StreamCursor::advance(this_00,1);
    if (!bVar2) {
      this_01 = *(ParsingContext **)this;
      errFmt = "Expected value after Tag %d, got EOF";
      type = Incomplete;
      goto LAB_00a84a73;
    }
    if (bVar4) {
      messageVisitor_1._8_8_ = *(undefined8 *)this;
      bVar3 = doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)89>,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::TagT<281u,Fixpp::Type::Char>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)89>,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::TagT<281u,Fixpp::Type::Char>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>,0ul,1ul,2ul,3ul,4ul>
                        ((long)(header.
                                super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                .
                                super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                .unparsed.Storage.InlineElts + 8) + 0x10,local_34,
                         &messageVisitor_1.strict);
      bVar2 = true;
      if (bVar3) goto LAB_00a848db;
    }
    else {
      messageVisitor_1._8_8_ = *(undefined8 *)this;
      bVar3 = doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type:___l,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul>
                        (local_470,local_34,&messageVisitor_1.strict);
      bVar2 = false;
      if (bVar3) goto LAB_00a848db;
      message.
      super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
      .
      super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
      .unparsed.Storage.InlineElts[8].super_AlignedCharArray<8UL,_24UL>.buffer._16_8_ =
           *(undefined8 *)this;
      messageVisitor_1.context._0_2_ = 0;
      bVar3 = doVisitField<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)89>,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::TagT<281u,Fixpp::Type::Char>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::impl::FieldVisitor<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)89>,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::TagT<281u,Fixpp::Type::Char>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>,0ul,1ul,2ul,3ul,4ul>
                        ((long)(header.
                                super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                .
                                super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                                .unparsed.Storage.InlineElts + 8) + 0x10,local_34,
                         (long)(message.
                                super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                                .
                                super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                                .unparsed.Storage.InlineElts + 8) + 0x10);
      bVar2 = true;
      if (bVar3) goto LAB_00a848db;
      bVar2 = false;
    }
    if (local_34 == 10) {
      bVar2 = match_int_fast(&local_38,this_00);
      if (bVar2) goto LAB_00a84a8f;
      this_01 = *(ParsingContext **)this;
      bVar2 = StreamCursor::eof(this_00);
      cVar5 = '?';
      if (!bVar2) {
        cVar5 = StreamCursor::current(this_00);
      }
      errFmt = "Invalid checksum, expected int, got \'%c\'";
      goto LAB_00a84a5f;
    }
    messageVisitor_1._8_8_ = this_00;
    bVar3 = match_until_fast('|',this_00);
    if (!bVar3) {
      ParsingContext::setError
                (*(ParsingContext **)this,ParsingError,"Expected value after tag %d, got EOF",
                 (ulong)local_34);
      goto LAB_00a84adc;
    }
    if (bVar4) {
      handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)89>,Fixpp::Required<Fixpp::TagT<262u,Fixpp::Type::String>>,Fixpp::TagT<281u,Fixpp::Type::Char>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::TypedParsingContext<void>>
                (this,&messageVisitor_1.strict,
                 (long)(header.
                        super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                        .
                        super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                        .unparsed.Storage.InlineElts + 8) + 0x10);
    }
    else {
      handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::TypedParsingContext<void>>
                (this,&messageVisitor_1.strict,local_470);
    }
    bVar4 = StreamCursor::advance(this_00,1);
    if (!bVar4) {
      ParsingContext::setError(*(ParsingContext **)this,Incomplete,"Got early EOF");
LAB_00a84adc:
      llvm::
      SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
      ::~SmallVectorImpl((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed>
                          *)&message.
                             super_MessageRef<Fixpp::Chars<_Y_>,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                             .
                             super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<262U,_Fixpp::Type::String>_>,_Fixpp::TagT<281U,_Fixpp::Type::Char>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                             .allBits);
      llvm::
      SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
      ::~SmallVectorImpl((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>::Unparsed>
                          *)&header.
                             super_MessageRef<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                             .
                             super_MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                             .allBits);
      return;
    }
  } while( true );
}

Assistant:

void operator()(id<Header>, id<Message>)
            {
                Header header;
                Message message;

                enum class State {
                    InHeader,
                    InMessage
                };

                State state = State::InHeader;

                int checksum = 0;

                auto& cursor = context.cursor;

                while (!cursor.eof() && !hasError())
                {
                    int tag;

                    TRY_MATCH_INT(
                        tag,
                        "Encountered invalid tag, expected int, got '%c'",
                        CURSOR_CURRENT(cursor)
                    );
                    TRY_ADVANCE("Expected value after Tag %d, got EOF", tag);

                    if (state == State::InHeader)
                    {
                        FieldVisitor<Header> headerVisitor(context, Rules::StrictMode, Rules::SkipUnknownTags);
                        if (visitField(header, tag, headerVisitor))
                            continue;

                        FieldVisitor<Message> messageVisitor(context, Rules::StrictMode, Rules::SkipUnknownTags);
                        if (visitField(message, tag, messageVisitor))
                        {
                            state = State::InMessage;
                            continue;
                        }
                    }
                    else if (state == State::InMessage)
                    {
                        FieldVisitor<Message> messageVisitor(context, Rules::StrictMode, Rules::SkipUnknownTags);
                        if (visitField(message, tag, messageVisitor))
                            continue;
                    }

                    if (tag == 10)
                    {
                        TRY_MATCH_INT(
                            checksum,
                            "Invalid checksum, expected int, got '%c'",
                             CURSOR_CURRENT(cursor)
                        );
                        break;
                    }
                    else
                    {
                        StreamCursor::Token valueToken(cursor);
                        TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", tag);

                        if (state == State::InHeader)
                            handleUnknownTag(valueToken, header, context, tag,
                                    BoolPack<Rules::SkipUnknownTags, Rules::StrictMode>{});
                        else
                            handleUnknownTag(valueToken, message, context, tag,
                                    BoolPack<Rules::SkipUnknownTags, Rules::StrictMode>{});

                    }

                    TRY_ADVANCE("Got early EOF");

                }

                if (!hasError())
                    callVisitor(header, message, std::is_void<typename Context::Type>{});
            }